

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expreplay.h
# Opt level: O0

void ExpReplay::predict_or_learn<true,MULTICLASS::mc_label>
               (expreplay *er,single_learner *base,example *ec)

{
  ulong uVar1;
  example *src;
  long in_RDX;
  long in_RDI;
  float fVar2;
  size_t n;
  size_t n_1;
  size_t replay;
  undefined4 in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffc4;
  float in_stack_ffffffffffffffc8;
  float in_stack_ffffffffffffffcc;
  learner<char,_example> *in_stack_ffffffffffffffd0;
  example *in_stack_ffffffffffffffd8;
  ulong uVar3;
  undefined1 audit;
  
  LEARNER::learner<char,_example>::predict
            (in_stack_ffffffffffffffd0,
             (example *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  fVar2 = (float)(*(code *)MULTICLASS::mc_label._40_8_)(in_RDX + 0x6828);
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    for (uVar3 = 1; uVar3 < *(ulong *)(in_RDI + 0x20); uVar3 = uVar3 + 1) {
      in_stack_ffffffffffffffc4 =
           merand48((uint64_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      in_stack_ffffffffffffffc8 = (float)(long)*(ulong *)(in_RDI + 8);
      in_stack_ffffffffffffffcc = (float)*(ulong *)(in_RDI + 8);
      uVar1 = (ulong)(in_stack_ffffffffffffffc4 * in_stack_ffffffffffffffcc);
      in_stack_ffffffffffffffd8 =
           (example *)
           (uVar1 | (long)(in_stack_ffffffffffffffc4 * in_stack_ffffffffffffffcc - 9.223372e+18) &
                    (long)uVar1 >> 0x3f);
      if ((*(byte *)((long)(in_stack_ffffffffffffffd8->super_example_predict).feature_space +
                    *(long *)(in_RDI + 0x18) + -0x20) & 1) != 0) {
        LEARNER::learner<char,_example>::learn
                  (in_stack_ffffffffffffffd0,
                   (example *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                   CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      }
    }
    fVar2 = merand48((uint64_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    audit = (undefined1)(uVar3 >> 0x38);
    fVar2 = fVar2 * (float)*(ulong *)(in_RDI + 8);
    uVar3 = (ulong)fVar2;
    src = (example *)(uVar3 | (long)(fVar2 - 9.223372e+18) & (long)uVar3 >> 0x3f);
    if ((*(byte *)((long)(src->super_example_predict).feature_space +
                  *(long *)(in_RDI + 0x18) + -0x20) & 1) != 0) {
      LEARNER::learner<char,_example>::learn
                ((learner<char,_example> *)src,
                 (example *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                 CONCAT44(in_stack_ffffffffffffffc4,(float)*(ulong *)(in_RDI + 8)));
    }
    *(undefined1 *)
     ((long)(src->super_example_predict).feature_space + *(long *)(in_RDI + 0x18) + -0x20) = 1;
    VW::copy_example_data((bool)audit,in_stack_ffffffffffffffd8,src);
    if (MULTICLASS::mc_label._48_8_ == 0) {
      memcpy((void *)(*(long *)(in_RDI + 0x10) + (long)src * 0x68d0 + 0x6828),
             (void *)(in_RDX + 0x6828),0x28);
    }
    else {
      (*(code *)MULTICLASS::mc_label._48_8_)
                (*(long *)(in_RDI + 0x10) + (long)src * 0x68d0 + 0x6828,in_RDX + 0x6828);
    }
  }
  return;
}

Assistant:

void predict_or_learn(expreplay& er, LEARNER::single_learner& base, example& ec)
{  // regardless of what happens, we must predict
  base.predict(ec);
  // if we're not learning, that's all that has to happen
  if (!is_learn || lp.get_weight(&ec.l) == 0.)
    return;

  for (size_t replay = 1; replay < er.replay_count; replay++)
  {
    size_t n = (size_t)(merand48(er.all->random_state) * (float)er.N);
    if (er.filled[n])
      base.learn(er.buf[n]);
  }

  size_t n = (size_t)(merand48(er.all->random_state) * (float)er.N);
  if (er.filled[n])
    base.learn(er.buf[n]);

  er.filled[n] = true;
  VW::copy_example_data(er.all->audit, &er.buf[n], &ec);  // don't copy the label
  if (lp.copy_label)
    lp.copy_label(&er.buf[n].l, &ec.l);
  else
    er.buf[n].l = ec.l;
}